

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::updateGeometries(QAbstractItemView *this)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  (**(code **)(*(long *)this + 0x260))();
  QBasicTimer::start(lVar1 + 0x53c,0,1,this);
  if ((*(int *)(lVar1 + 0x2ac) != 0) &&
     ((*(int *)(lVar1 + 0x2ac) == 2 || (*(char *)(lVar1 + 0x2a0) == '\0')))) {
    QWidget::updateGeometry(*(QWidget **)(lVar1 + 8));
    return;
  }
  return;
}

Assistant:

void QAbstractItemView::updateGeometries()
{
    Q_D(QAbstractItemView);
    updateEditorGeometries();
    d->fetchMoreTimer.start(0, this); //fetch more later
    d->updateGeometry();
}